

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

Lazy<std::pair<std::error_code,_unsigned_long>_> __thiscall
cinatra::coro_http_client::async_read_until<asio::basic_streambuf<std::allocator<char>>>
          (coro_http_client *this,basic_streambuf<std::allocator<char>_> *buffer,string_view delim)

{
  LazyBase<std::pair<std::error_code,_unsigned_long>,_false> in_RDI;
  basic_streambuf<std::allocator<char>_> *in_stack_00000170;
  basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *in_stack_00000178;
  undefined1 in_stack_00000180 [16];
  
  std::
  __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x17c9ca);
  coro_io::
  async_read_until<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::basic_streambuf<std::allocator<char>>>
            (in_stack_00000178,in_stack_00000170,(string_view)in_stack_00000180);
  return (Lazy<std::pair<std::error_code,_unsigned_long>_>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<std::pair<std::error_code, size_t>> async_read_until(
      AsioBuffer &buffer, asio::string_view delim) noexcept {
#ifdef INJECT_FOR_HTTP_CLIENT_TEST
    if (read_failed_forever_) {
      return async_read_failed();
    }
#endif
#ifdef CINATRA_ENABLE_SSL
    if (has_init_ssl_) {
      return coro_io::async_read_until(*socket_->ssl_stream_, buffer, delim);
    }
    else {
#endif
      return coro_io::async_read_until(socket_->impl_, buffer, delim);
#ifdef CINATRA_ENABLE_SSL
    }
#endif
  }

  static void close_socket(socket_t &socket) {
    std::error_code ec;
    socket.impl_.shutdown(asio::ip::tcp::socket::shutdown_both, ec);
    socket.impl_.close(ec);
    socket.has_closed_ = true;
  }

  async_simple::coro::Lazy<bool> timeout(
      auto &timer, std::chrono::steady_clock::duration duration,
      std::string msg) {
    auto watcher = std::weak_ptr(socket_);
    timer.expires_after(duration);
    auto is_timeout = co_await timer.async_await();
    if (!is_timeout) {
      co_return false;
    }
    if (auto socket = watcher.lock(); socket) {
      socket_->is_timeout_ = true;
      CINATRA_LOG_WARNING << msg << " timeout";
      close_socket(*socket_);
    }
    co_return true;
  }

  template <typename S>
  bool has_schema(const S &url) {
    size_t pos_http = url.find("http://");
    size_t pos_https = url.find("https://");
    size_t pos_ws = url.find("ws://");
    size_t pos_wss = url.find("wss://");
    bool has_http_scheme =
        ((pos_http != std::string::npos) && pos_http == 0) ||
        ((pos_https != std::string::npos) && pos_https == 0) ||
        ((pos_ws != std::string::npos) && pos_ws == 0) ||
        ((pos_wss != std::string::npos) && pos_wss == 0);
    return has_http_scheme;
  }

  friend class multipart_reader_t<coro_http_client>;
  http_parser parser_;
  coro_io::ExecutorWrapper<> executor_wrapper_;
  coro_io::period_timer timer_;
  std::shared_ptr<socket_t> socket_;
  asio::streambuf &head_buf_;
  asio::streambuf &chunked_buf_;
  std::string body_;

  std::unordered_map<std::string, std::string> req_headers_;

  std::string proxy_request_uri_ = "";
  std::string proxy_host_;
  std::string proxy_port_;

  std::string proxy_basic_auth_username_;
  std::string proxy_basic_auth_password_;

  std::string proxy_bearer_token_auth_token_;

  std::map<std::string, multipart_t> form_data_;
  size_t max_single_part_size_ = 1024 * 1024;

  std::string ws_sec_key_;
  std::string host_;
  std::string port_;

#ifdef CINATRA_ENABLE_SSL
  std::unique_ptr<asio::ssl::context> ssl_ctx_ = nullptr;
  bool has_init_ssl_ = false;
  bool is_ssl_schema_ = false;
  bool need_set_sni_host_ = true;
#endif
  std::string redirect_uri_;
  bool enable_follow_redirect_ = false;
  std::chrono::steady_clock::duration conn_timeout_duration_ =
      std::chrono::seconds(30);
  std::chrono::steady_clock::duration req_timeout_duration_ =
      std::chrono::seconds(60);
  bool enable_tcp_no_delay_ = true;
  std::string resp_chunk_str_;
  std::span<char> out_buf_;
  bool should_reset_ = false;
  config config_;

  bool enable_ws_deflate_ = false;
#ifdef CINATRA_ENABLE_GZIP
  bool is_server_support_ws_deflate_ = false;
  std::string inflate_str_;
#endif
  content_encoding encoding_type_ = content_encoding::none;
  int64_t max_http_body_len_ = MAX_HTTP_BODY_SIZE;

#if defined(CINATRA_ENABLE_BROTLI) || defined(CINATRA_ENABLE_GZIP)
  std::string uncompressed_str_;
#endif

#ifdef BENCHMARK_TEST
  bool stop_bench_ = false;
  size_t total_len_ = 0;
#endif
#ifdef INJECT_FOR_HTTP_CLIENT_TEST
 public:
  bool write_failed_forever_ = false;
  bool connect_timeout_forever_ = false;
  bool parse_failed_forever_ = false;
  bool read_failed_forever_ = false;
  bool write_header_timeout_ = false;
  bool write_payload_timeout_ = false;
  bool read_timeout_ = false;
#endif
};

}